

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_minmax(_func_void_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_minmax_into)

{
  ulong in_RAX;
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  mp_int *pmVar2;
  size_t i;
  ulong uVar3;
  ulong uStack_38;
  uint8_t lens [2];
  
  uStack_38 = in_RAX;
  x = mp_new(0x100);
  x_00 = mp_new(0x100);
  uVar3 = 0;
  while( true ) {
    sVar1 = (*looplimit)(10);
    if (sVar1 <= uVar3) break;
    random_read(lens,2);
    pmVar2 = mp_random_bits_fn(uStack_38 >> 0x30 & 0xff,random_read);
    mp_copy_into(x,pmVar2);
    mp_free(pmVar2);
    pmVar2 = mp_random_bits_fn(uStack_38 >> 0x38,random_read);
    mp_copy_into(x,pmVar2);
    mp_free(pmVar2);
    log_start();
    (*mp_minmax_into)(x,x,x_00);
    log_end();
    uVar3 = uVar3 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_minmax(
    void (*mp_minmax_into)(mp_int *r, mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(256);
    for (size_t i = 0; i < looplimit(10); i++) {
        uint8_t lens[2];
        random_read(lens, 2);
        mp_int *x = mp_random_bits(lens[0]);
        mp_copy_into(a, x);
        mp_free(x);
        mp_int *y = mp_random_bits(lens[1]);
        mp_copy_into(a, y);
        mp_free(y);
        log_start();
        mp_minmax_into(a, a, b);
        log_end();
    }
    mp_free(a);
    mp_free(b);
}